

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

void FlatStream_Close(TBlockStream *pStream)

{
  undefined4 local_28;
  undefined4 local_24;
  FILE_BITMAP_FOOTER Footer;
  TBlockStream *pStream_local;
  
  Footer._16_8_ = pStream;
  if ((pStream->FileBitmap != (void *)0x0) && (pStream->IsModified != 0)) {
    (*(pStream->super_TFileStream).BaseWrite)
              (&pStream->super_TFileStream,&(pStream->super_TFileStream).StreamSize,
               pStream->FileBitmap,pStream->BitmapSize);
    local_28 = 0x33767470;
    local_24 = 3;
    Footer.Signature = *(DWORD *)(Footer._16_8_ + 200);
    Footer.Version = (DWORD)*(undefined8 *)(Footer._16_8_ + 0xb8);
    Footer.BuildNumber = (DWORD)((ulong)*(undefined8 *)(Footer._16_8_ + 0xb8) >> 0x20);
    Footer.MapOffsetLo = *(DWORD *)(Footer._16_8_ + 0xec);
    (**(code **)(Footer._16_8_ + 0x58))(Footer._16_8_,0,&local_28,0x18);
  }
  BlockStream_Close((TBlockStream *)Footer._16_8_);
  return;
}

Assistant:

static void FlatStream_Close(TBlockStream * pStream)
{
    FILE_BITMAP_FOOTER Footer;

    if(pStream->FileBitmap && pStream->IsModified)
    {
        // Write the file bitmap
        pStream->BaseWrite(pStream, &pStream->StreamSize, pStream->FileBitmap, pStream->BitmapSize);

        // Prepare and write the file footer
        Footer.Signature   = ID_FILE_BITMAP_FOOTER;
        Footer.Version     = 3;
        Footer.BuildNumber = pStream->BuildNumber;
        Footer.MapOffsetLo = (DWORD)(pStream->StreamSize & 0xFFFFFFFF);
        Footer.MapOffsetHi = (DWORD)(pStream->StreamSize >> 0x20);
        Footer.BlockSize   = pStream->BlockSize;
        BSWAP_ARRAY32_UNSIGNED(&Footer, sizeof(FILE_BITMAP_FOOTER));
        pStream->BaseWrite(pStream, NULL, &Footer, sizeof(FILE_BITMAP_FOOTER));
    }

    // Close the base class
    BlockStream_Close(pStream);
}